

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_enc.c
# Opt level: O1

int WebPValidateConfig(WebPConfig *config)

{
  uint uVar1;
  
  uVar1 = 0;
  if ((((((((config != (WebPConfig *)0x0) && (0.0 <= config->quality)) && (config->quality <= 100.0)
          ) && (((-1 < config->target_size &&
                 (0.0 < config->target_PSNR || config->target_PSNR == 0.0)) &&
                (((uint)config->method < 7 &&
                 ((0xfffffffb < config->segments - 5U && ((uint)config->sns_strength < 0x65))))))))
        && ((uint)config->filter_strength < 0x65)) &&
       ((((uint)config->filter_sharpness < 8 && ((uint)config->filter_type < 2)) &&
        ((uint)config->autofilter < 2)))) &&
      (((0xfffffff5 < config->pass - 0xbU && (-1 < config->qmin)) &&
       ((config->qmin <= config->qmax && config->qmax < 0x65 &&
        (((uint)config->show_compressed < 2 && ((uint)config->preprocessing < 8)))))))) &&
     ((((uint)config->partitions < 4 &&
       ((((((uint)config->partition_limit < 0x65 && (-1 < config->alpha_compression)) &&
          (-1 < config->alpha_filtering)) &&
         (((uint)config->alpha_quality < 0x65 && ((uint)config->lossless < 2)))) &&
        (((uint)config->near_lossless < 0x65 &&
         ((config->image_hint < WEBP_HINT_LAST && ((uint)config->emulate_jpeg_size < 2)))))))) &&
      (((uint)config->thread_level < 2 &&
       ((((uint)config->low_memory < 2 && ((uint)config->exact < 2)) &&
        ((uint)config->use_delta_palette < 2)))))))) {
    uVar1 = (uint)((uint)config->use_sharp_yuv < 2);
  }
  return uVar1;
}

Assistant:

int WebPValidateConfig(const WebPConfig* config) {
  if (config == NULL) return 0;
  if (config->quality < 0 || config->quality > 100) return 0;
  if (config->target_size < 0) return 0;
  if (config->target_PSNR < 0) return 0;
  if (config->method < 0 || config->method > 6) return 0;
  if (config->segments < 1 || config->segments > 4) return 0;
  if (config->sns_strength < 0 || config->sns_strength > 100) return 0;
  if (config->filter_strength < 0 || config->filter_strength > 100) return 0;
  if (config->filter_sharpness < 0 || config->filter_sharpness > 7) return 0;
  if (config->filter_type < 0 || config->filter_type > 1) return 0;
  if (config->autofilter < 0 || config->autofilter > 1) return 0;
  if (config->pass < 1 || config->pass > 10) return 0;
  if (config->qmin < 0 || config->qmax > 100 || config->qmin > config->qmax) {
    return 0;
  }
  if (config->show_compressed < 0 || config->show_compressed > 1) return 0;
  if (config->preprocessing < 0 || config->preprocessing > 7) return 0;
  if (config->partitions < 0 || config->partitions > 3) return 0;
  if (config->partition_limit < 0 || config->partition_limit > 100) return 0;
  if (config->alpha_compression < 0) return 0;
  if (config->alpha_filtering < 0) return 0;
  if (config->alpha_quality < 0 || config->alpha_quality > 100) return 0;
  if (config->lossless < 0 || config->lossless > 1) return 0;
  if (config->near_lossless < 0 || config->near_lossless > 100) return 0;
  if (config->image_hint >= WEBP_HINT_LAST) return 0;
  if (config->emulate_jpeg_size < 0 || config->emulate_jpeg_size > 1) return 0;
  if (config->thread_level < 0 || config->thread_level > 1) return 0;
  if (config->low_memory < 0 || config->low_memory > 1) return 0;
  if (config->exact < 0 || config->exact > 1) return 0;
  if (config->use_delta_palette < 0 || config->use_delta_palette > 1) {
    return 0;
  }
  if (config->use_sharp_yuv < 0 || config->use_sharp_yuv > 1) return 0;

  return 1;
}